

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O2

bool absl::CUnescape(string_view source,Nonnull<std::string_*> dest,Nullable<std::string_*> error)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  char32_t c;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  byte *pbVar8;
  byte *pbVar9;
  anon_unknown_0 *this;
  byte *pbVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Nullable<std::string_*> in_R8;
  byte *buffer;
  long lVar11;
  long lVar12;
  string_view src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  byte *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  byte *local_40;
  Nonnull<std::string_*> local_38;
  
  pbVar8 = (byte *)source._M_str;
  std::__cxx11::string::resize((ulong)dest);
  local_40 = (byte *)(dest->_M_dataplus)._M_p;
  pbVar2 = pbVar8 + source._M_len;
  pbVar10 = pbVar8 + (source._M_len - 1);
  buffer = local_40;
  for (; ((local_38 = dest, buffer == pbVar8 && (pbVar8 < pbVar2)) && (*pbVar8 != 0x5c));
      pbVar8 = pbVar8 + 1) {
    buffer = buffer + 1;
  }
  do {
    if (pbVar2 <= pbVar8) {
      std::__cxx11::string::erase((ulong)local_38,(long)buffer - (long)local_40);
LAB_0024bf01:
      return pbVar2 <= pbVar8;
    }
    if (*pbVar8 != 0x5c) {
      *buffer = *pbVar8;
      buffer = buffer + 1;
      goto LAB_0024bcd5;
    }
    pbVar1 = pbVar8 + 1;
    if (pbVar10 < pbVar1) {
joined_r0x0024bf90:
      if (error != (Nullable<std::string_*>)0x0) {
        std::__cxx11::string::assign((char *)error);
      }
      goto LAB_0024bf01;
    }
    bVar3 = *pbVar1;
    uVar5 = bVar3 - 0x30;
    if (uVar5 < 8) {
      pbVar9 = pbVar1;
      if ((pbVar1 < pbVar10) && ((pbVar8[2] & 0xf8) == 0x30)) {
        uVar5 = ((uint)pbVar8[2] + uVar5 * 8) - 0x30;
        pbVar9 = pbVar8 + 2;
      }
      if ((pbVar10 <= pbVar9) || ((pbVar9[1] & 0xf8) != 0x30)) {
        *buffer = (byte)uVar5;
        pbVar8 = pbVar9;
LAB_0024bbc0:
        buffer = buffer + 1;
        goto LAB_0024bcd5;
      }
      uVar5 = ((uint)pbVar9[1] + uVar5 * 8) - 0x30;
      if (uVar5 < 0x100) {
        *buffer = (byte)uVar5;
        pbVar8 = pbVar9 + 1;
        goto LAB_0024bbc0;
      }
      if (error != (Nullable<std::string_*>)0x0) {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,pbVar1,pbVar9 + 2);
        std::operator+(&local_a8,"Value of \\",&local_80);
        std::operator+(&local_60,&local_a8," exceeds 0xff");
LAB_0024bed0:
        std::__cxx11::string::operator=((string *)error,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_a8);
        this_00 = &local_80;
LAB_0024bef7:
        std::__cxx11::string::~string((string *)this_00);
      }
      goto LAB_0024bf01;
    }
    switch(bVar3) {
    case 0x6e:
      *buffer = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x77:
switchD_0024bb7e_caseD_6f:
      if (error != (Nullable<std::string_*>)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,"Unknown escape sequence: \\",(allocator<char> *)&local_80);
        std::operator+(&local_60,&local_a8,*pbVar1);
LAB_0024be56:
        std::__cxx11::string::operator=((string *)error,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        this_00 = &local_a8;
        goto LAB_0024bef7;
      }
      goto LAB_0024bf01;
    case 0x72:
      *buffer = 0xd;
      break;
    case 0x74:
      *buffer = 9;
      break;
    case 0x75:
      if (pbVar8 + 5 < pbVar2) {
        lVar11 = 0;
        this = (anon_unknown_0 *)0x0;
        local_88 = pbVar10;
        for (lVar12 = 0; (int)lVar12 != 4; lVar12 = lVar12 + 1) {
          if (-1 < (char)(&ascii_internal::kPropertyBits)[pbVar8[lVar12 + 2]]) {
            if (error == (Nullable<std::string_*>)0x0) goto LAB_0024bf01;
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,pbVar1,pbVar8 + (2 - lVar11));
            std::operator+(&local_60,"\\u must be followed by 4 hex digits: \\",&local_a8);
            goto LAB_0024be56;
          }
          uVar5 = anon_unknown_0::hex_digit_to_int(pbVar8[lVar12 + 2]);
          this = (anon_unknown_0 *)(ulong)((int)this << 4 | uVar5);
          lVar11 = lVar11 + -1;
        }
        c = L'\x05';
LAB_0024bd3e:
        src._M_str = (char *)error;
        src._M_len = (size_t)pbVar1;
        bVar4 = anon_unknown_0::IsSurrogate(this,c,src,in_R8);
        if (!bVar4) {
          pbVar8 = pbVar1 + -lVar11;
          sVar7 = strings_internal::EncodeUTF8Char((char *)buffer,(char32_t)this);
          buffer = buffer + sVar7;
          pbVar10 = local_88;
          goto LAB_0024bcd5;
        }
      }
      else if (error != (Nullable<std::string_*>)0x0) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        local_a8.field_2._M_local_buf[0] = *pbVar1;
        local_a8._M_string_length = 1;
        local_a8.field_2._M_local_buf[1] = '\0';
        std::operator+(&local_60,"\\u must be followed by 4 hex digits: \\",&local_a8);
        goto LAB_0024be56;
      }
      goto LAB_0024bf01;
    case 0x76:
      *buffer = 0xb;
      break;
    case 0x78:
switchD_0024bb7e_caseD_78:
      if ((pbVar10 <= pbVar1) || (-1 < (char)(&ascii_internal::kPropertyBits)[pbVar8[2]]))
      goto joined_r0x0024bf90;
      pbVar9 = pbVar8 + 2;
      uVar5 = 0;
      while ((pbVar9 + -1 < pbVar10 && ((char)(&ascii_internal::kPropertyBits)[*pbVar9] < '\0'))) {
        uVar6 = anon_unknown_0::hex_digit_to_int(*pbVar9);
        uVar5 = uVar5 << 4 | uVar6;
        pbVar9 = pbVar9 + 1;
      }
      if (uVar5 < 0x100) {
        *buffer = (byte)uVar5;
        buffer = buffer + 1;
        pbVar8 = pbVar9 + -1;
        goto LAB_0024bcd5;
      }
      if (error != (Nullable<std::string_*>)0x0) {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,pbVar1,pbVar9);
        std::operator+(&local_a8,"Value of \\",&local_80);
        std::operator+(&local_60,&local_a8," exceeds 0xff");
        goto LAB_0024bed0;
      }
      goto LAB_0024bf01;
    default:
      if (bVar3 == 0x22) {
        *buffer = 0x22;
      }
      else if (bVar3 == 0x27) {
        *buffer = 0x27;
      }
      else if (bVar3 == 0x3f) {
        *buffer = 0x3f;
      }
      else {
        if (bVar3 == 0x55) {
          if (pbVar8 + 9 < pbVar2) {
            lVar11 = 0;
            this = (anon_unknown_0 *)0x0;
            local_88 = pbVar10;
            for (lVar12 = 0; (int)lVar12 != 8; lVar12 = lVar12 + 1) {
              if (-1 < (char)(&ascii_internal::kPropertyBits)[pbVar8[lVar12 + 2]]) {
                if (error == (Nullable<std::string_*>)0x0) goto LAB_0024bf01;
                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_a8,pbVar1,pbVar8 + (2 - lVar11));
                std::operator+(&local_60,"\\U must be followed by 8 hex digits: \\",&local_a8);
                goto LAB_0024be56;
              }
              uVar5 = anon_unknown_0::hex_digit_to_int(pbVar8[lVar12 + 2]);
              if (0x10fff < (uint)this) {
                if (error == (Nullable<std::string_*>)0x0) goto LAB_0024bf01;
                local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_80,pbVar1,pbVar8 + (3 - lVar11));
                std::operator+(&local_a8,"Value of \\",&local_80);
                std::operator+(&local_60,&local_a8," exceeds Unicode limit (0x10FFFF)");
                goto LAB_0024bed0;
              }
              this = (anon_unknown_0 *)(ulong)((uint)this << 4 | uVar5);
              lVar11 = lVar11 + -1;
            }
            c = L'\t';
            goto LAB_0024bd3e;
          }
          if (error != (Nullable<std::string_*>)0x0) {
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            local_a8.field_2._M_local_buf[0] = *pbVar1;
            local_a8._M_string_length = 1;
            local_a8.field_2._M_local_buf[1] = '\0';
            std::operator+(&local_60,"\\U must be followed by 8 hex digits: \\",&local_a8);
            goto LAB_0024be56;
          }
          goto LAB_0024bf01;
        }
        if (bVar3 == 0x58) goto switchD_0024bb7e_caseD_78;
        if (bVar3 == 0x5c) {
          *buffer = 0x5c;
        }
        else if (bVar3 == 0x66) {
          *buffer = 0xc;
        }
        else if (bVar3 == 0x62) {
          *buffer = 8;
        }
        else {
          if (bVar3 != 0x61) goto switchD_0024bb7e_caseD_6f;
          *buffer = 7;
        }
      }
    }
    buffer = buffer + 1;
    pbVar8 = pbVar1;
LAB_0024bcd5:
    pbVar8 = pbVar8 + 1;
  } while( true );
}

Assistant:

bool CUnescape(absl::string_view source, absl::Nonnull<std::string*> dest,
               absl::Nullable<std::string*> error) {
  return CUnescapeInternal(source, kUnescapeNulls, dest, error);
}